

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

bool __thiscall
HdlcSimulationDataGenerator::ContainsElement(HdlcSimulationDataGenerator *this,U32 index)

{
  size_type sVar1;
  const_reference pvVar2;
  uint local_20;
  U32 i;
  U32 index_local;
  HdlcSimulationDataGenerator *this_local;
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->mAbortFramesIndexes);
    if (sVar1 <= local_20) {
      return false;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&this->mAbortFramesIndexes,(ulong)local_20);
    if (*pvVar2 == index) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool HdlcSimulationDataGenerator::ContainsElement( U32 index ) const
{
    for( U32 i = 0; i < mAbortFramesIndexes.size(); ++i )
    {
        if( mAbortFramesIndexes.at( i ) == index )
        {
            return true;
        }
    }
    return false;
}